

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon.cxx
# Opt level: O0

void __thiscall Fl_File_Icon::Fl_File_Icon(Fl_File_Icon *this,char *p,int t,int nd,short *d)

{
  short *psVar1;
  short *d_local;
  int nd_local;
  int t_local;
  char *p_local;
  Fl_File_Icon *this_local;
  
  this->pattern_ = p;
  this->type_ = t;
  if (nd == 0) {
    this->num_data_ = 0;
    this->alloc_data_ = 0;
  }
  else {
    this->num_data_ = nd;
    this->alloc_data_ = nd + 1;
    psVar1 = (short *)calloc(2,(long)(nd + 1));
    this->data_ = psVar1;
    memcpy(this->data_,d,(long)nd << 1);
  }
  this->next_ = first_;
  first_ = this;
  return;
}

Assistant:

Fl_File_Icon::Fl_File_Icon(const char *p,	/* I - Filename pattern */
                	   int        t,	/* I - File type */
			   int        nd,	/* I - Number of data values */
			   short      *d)	/* I - Data values */
{
  // Initialize the pattern and type...
  pattern_ = p;
  type_    = t;

  // Copy icon data as needed...
  if (nd)
  {
    num_data_   = nd;
    alloc_data_ = nd + 1;
    data_       = (short *)calloc(sizeof(short), nd + 1);
    memcpy(data_, d, nd * sizeof(short));
  }
  else
  {
    num_data_   = 0;
    alloc_data_ = 0;
  }

  // And add the icon to the list of icons...
  next_  = first_;
  first_ = this;
}